

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

bool __thiscall cmFileAPI::ReadJsonFile(cmFileAPI *this,string *file,Value *value,string *error)

{
  CharReader *pCVar1;
  bool bVar2;
  int iVar3;
  size_type __new_size;
  vector<char,_std::allocator<char>_> content;
  Value local_260;
  ifstream fin;
  long local_228 [2];
  byte abStack_218 [488];
  
  content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  content.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&fin);
  bVar2 = cmsys::SystemTools::FileIsDirectory(file);
  if (!bVar2) {
    std::ifstream::open((char *)&fin,(_Ios_Openmode)(file->_M_dataplus)._M_p);
  }
  __new_size = (**(code **)(local_228[0] + 0x20))(local_228,0,2,0x18);
  if (0 < (long)__new_size) {
    std::vector<char,_std::allocator<char>_>::resize(&content,__new_size);
    std::istream::seekg((long)&fin,_S_beg);
    std::istream::read((char *)&fin,
                       (long)content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
  }
  std::ifstream::close();
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    pCVar1 = (this->JsonReader)._M_t.
             super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
             super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
             super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl;
    iVar3 = (*pCVar1->_vptr_CharReader[2])
                      (pCVar1,content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                       content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,value,error);
    bVar2 = true;
    if ((char)iVar3 != '\0') goto LAB_00446cc7;
    Json::Value::Value(&local_260,nullValue);
    Json::Value::operator=(value,&local_260);
    Json::Value::~Value(&local_260);
  }
  else {
    Json::Value::Value(&local_260,nullValue);
    Json::Value::operator=(value,&local_260);
    Json::Value::~Value(&local_260);
    std::__cxx11::string::assign((char *)error);
  }
  bVar2 = false;
LAB_00446cc7:
  std::ifstream::~ifstream(&fin);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&content.super__Vector_base<char,_std::allocator<char>_>);
  return bVar2;
}

Assistant:

bool cmFileAPI::ReadJsonFile(std::string const& file, Json::Value& value,
                             std::string& error)
{
  std::vector<char> content;

  cmsys::ifstream fin;
  if (!cmSystemTools::FileIsDirectory(file)) {
    fin.open(file.c_str(), std::ios::binary);
  }
  auto finEnd = fin.rdbuf()->pubseekoff(0, std::ios::end);
  if (finEnd > 0) {
    size_t finSize = finEnd;
    try {
      // Allocate a buffer to read the whole file.
      content.resize(finSize);

      // Now read the file from the beginning.
      fin.seekg(0, std::ios::beg);
      fin.read(content.data(), finSize);
    } catch (...) {
      fin.setstate(std::ios::failbit);
    }
  }
  fin.close();
  if (!fin) {
    value = Json::Value();
    error = "failed to read from file";
    return false;
  }

  // Parse our buffer as json.
  if (!this->JsonReader->parse(content.data(), content.data() + content.size(),
                               &value, &error)) {
    value = Json::Value();
    return false;
  }

  return true;
}